

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

char * gl4cts::apiToTestName(API api)

{
  char *pcStack_10;
  API api_local;
  
  if (api == API_GL_45core) {
    pcStack_10 = "clip_control";
  }
  else if (api == API_GL_ARB_clip_control) {
    pcStack_10 = "clip_control_ARB";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* apiToTestName(ClipControlTests::API api)
{
	switch (api)
	{
	case ClipControlTests::API_GL_45core:
		return "clip_control";
	case ClipControlTests::API_GL_ARB_clip_control:
		return "clip_control_ARB";
	}
	DE_ASSERT(0);
	return "";
}